

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>
::mapbase_evaluator(mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>
                    *this,XprType *map)

{
  Scalar *pSVar1;
  Index IVar2;
  XprType *map_local;
  mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>
  *this_local;
  
  evaluator_base<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  evaluator_base((evaluator_base<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)this);
  pSVar1 = MapBase<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
           ::data(&map->
                   super_MapBase<Eigen::Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 );
  this->m_data = pSVar1;
  IVar2 = Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>::innerStride(map);
  variable_if_dynamic<long,_1>::variable_if_dynamic
            ((variable_if_dynamic<long,_1> *)&this->field_0x8,IVar2);
  IVar2 = Map<const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>::outerStride(map);
  variable_if_dynamic<long,_4>::variable_if_dynamic
            ((variable_if_dynamic<long,_4> *)&this->field_0x9,IVar2);
  return;
}

Assistant:

explicit mapbase_evaluator(const XprType& map)
    : m_data(const_cast<PointerType>(map.data())),
      m_innerStride(map.innerStride()),
      m_outerStride(map.outerStride())
  {
    EIGEN_STATIC_ASSERT(EIGEN_IMPLIES(evaluator<Derived>::Flags&PacketAccessBit, internal::inner_stride_at_compile_time<Derived>::ret==1),
                        PACKET_ACCESS_REQUIRES_TO_HAVE_INNER_STRIDE_FIXED_TO_1);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
  }